

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestEmptyBinaryDirectoryCommand.h
# Opt level: O0

cmCommand * __thiscall
cmCTestEmptyBinaryDirectoryCommand::Clone(cmCTestEmptyBinaryDirectoryCommand *this)

{
  cmCommand *this_00;
  cmCTestEmptyBinaryDirectoryCommand *ni;
  cmCTestEmptyBinaryDirectoryCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x40);
  cmCTestEmptyBinaryDirectoryCommand((cmCTestEmptyBinaryDirectoryCommand *)this_00);
  this_00[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestCommand).CTest;
  this_00[1].Makefile = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  return this_00;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestEmptyBinaryDirectoryCommand* ni =
      new cmCTestEmptyBinaryDirectoryCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }